

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::FReadFunc::~FReadFunc(FReadFunc *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~FReadFunc((FReadFunc *)0x990258);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

FReadFunc() : SystemSubroutine(KnownSystemName::FRead, SubroutineKind::Function) {
        hasOutputArgs = true;
    }